

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

string * __thiscall
ktx::DiffEnum<_khr_df_khr_descriptortype_e>::value_abi_cxx11_
          (string *__return_storage_ptr__,DiffEnum<_khr_df_khr_descriptortype_e> *this,size_t index,
          OutputFormat format)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  char *local_38 [2];
  char *local_28;
  
  __s = this->enumNames[index];
  if (format == text) {
    if (__s == (char *)0x0) {
      local_38[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_khr_descriptortype_e>).
                                             values[index].
                                             super__Optional_base<_khr_df_khr_descriptortype_e,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<_khr_df_khr_descriptortype_e>
                                             ._M_payload;
      this_00 = "0x{:x}";
      pcVar3 = (char *)0x6;
      sVar2 = 2;
    }
    else {
      if ((this->super_DiffBase<_khr_df_khr_descriptortype_e>).field_0x39 != '\x01') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar1 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,__s,__s + sVar1);
        return __return_storage_ptr__;
      }
      local_38[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_khr_descriptortype_e>).
                                             values[index].
                                             super__Optional_base<_khr_df_khr_descriptortype_e,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<_khr_df_khr_descriptortype_e>
                                             ._M_payload;
      this_00 = "0x{:x} ({})";
      pcVar3 = (char *)0xb;
      sVar2 = 0xc2;
      local_28 = __s;
    }
  }
  else if (__s == (char *)0x0) {
    local_38[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_khr_descriptortype_e>).
                                           values[index].
                                           super__Optional_base<_khr_df_khr_descriptortype_e,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<_khr_df_khr_descriptortype_e>
                                           ._M_payload;
    this_00 = "{}";
    pcVar3 = (char *)0x2;
    sVar2 = 1;
  }
  else {
    this_00 = "\"{}\"";
    pcVar3 = (char *)0x4;
    sVar2 = 0xc;
    local_38[0] = __s;
  }
  fmt.size_ = sVar2;
  fmt.data_ = pcVar3;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)this_00,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        if (format == OutputFormat::text) {
            if (enumNames[index]) {
                if (hexInText) {
                    return fmt::format("0x{:x} ({})", uint32_t(DiffBase<T>::rawValue(index)), enumNames[index]);
                } else {
                    return enumNames[index];
                }
            } else {
                return fmt::format("0x{:x}", uint32_t(DiffBase<T>::rawValue(index)));
            }
        } else {
            if (enumNames[index]) {
                return fmt::format("\"{}\"", enumNames[index]);
            } else {
                return fmt::format("{}", int32_t(DiffBase<T>::rawValue(index)));
            }
        }
    }